

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O1

int32_t uprv_compareASCIIPropertyNames_63(char *name1,char *name2)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  
  while( true ) {
    uVar4 = 0x100;
    pbVar3 = (byte *)name1;
    while( true ) {
      bVar1 = *pbVar3;
      if (((0x3f < bVar1 - 0x20) ||
          ((0x8000000000002001U >> ((ulong)(bVar1 - 0x20) & 0x3f) & 1) == 0)) &&
         (4 < (byte)(bVar1 - 9))) break;
      pbVar3 = pbVar3 + 1;
      uVar4 = uVar4 + 0x100;
    }
    if (bVar1 != 0) {
      bVar1 = uprv_asciitolower_63(bVar1);
      uVar4 = uVar4 + bVar1;
    }
    uVar5 = 0x100;
    pbVar3 = (byte *)name2;
    while( true ) {
      bVar1 = *pbVar3;
      if (((0x3f < bVar1 - 0x20) ||
          ((0x8000000000002001U >> ((ulong)(bVar1 - 0x20) & 0x3f) & 1) == 0)) &&
         (4 < (byte)(bVar1 - 9))) break;
      pbVar3 = pbVar3 + 1;
      uVar5 = uVar5 + 0x100;
    }
    if (bVar1 != 0) {
      bVar1 = uprv_asciitolower_63(bVar1);
      uVar5 = uVar5 + bVar1;
    }
    if ((char)uVar5 == '\0' && (char)uVar4 == '\0') break;
    if ((uVar4 != uVar5) && (iVar2 = (uVar4 & 0xff) - (uVar5 & 0xff), iVar2 != 0)) {
      return iVar2;
    }
    name1 = (char *)((byte *)name1 + ((int)uVar4 >> 8));
    name2 = (char *)((byte *)name2 + ((int)uVar5 >> 8));
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_compareASCIIPropertyNames(const char *name1, const char *name2) {
    int32_t rc, r1, r2;

    for(;;) {
        r1=getASCIIPropertyNameChar(name1);
        r2=getASCIIPropertyNameChar(name2);

        /* If we reach the ends of both strings then they match */
        if(((r1|r2)&0xff)==0) {
            return 0;
        }

        /* Compare the lowercased characters */
        if(r1!=r2) {
            rc=(r1&0xff)-(r2&0xff);
            if(rc!=0) {
                return rc;
            }
        }

        name1+=r1>>8;
        name2+=r2>>8;
    }
}